

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O2

void __thiscall QSizeGrip::QSizeGrip(QSizeGrip *this,QWidget *parent)

{
  QSizeGripPrivate *this_00;
  
  this_00 = (QSizeGripPrivate *)operator_new(0x298);
  QSizeGripPrivate::QSizeGripPrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007d3560;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QSizeGrip_007d3710;
  QSizeGripPrivate::init
            (*(QSizeGripPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QSizeGrip::QSizeGrip(QWidget * parent)
    : QWidget(*new QSizeGripPrivate, parent, { })
{
    Q_D(QSizeGrip);
    d->init();
}